

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

void __thiscall
KMaxDistance::addFirstPathToNodeAVL
          (KMaxDistance *this,MaxRec *srcRec,int idxOfDstNode,double edgeCost,int numDistMaxs,
          MaxRec **maxs,NodeAVL **queue)

{
  MaxRec *dst;
  NodeAVL *pNVar1;
  
  dst = createNewMaxRec(this,idxOfDstNode,numDistMaxs);
  copyVals(this,srcRec,dst);
  modifyDstMaxs(this,dst,edgeCost);
  dst->back = srcRec;
  pNVar1 = avlInsert(queue,dst->sumVals,dst);
  dst->qPtr = pNVar1;
  maxs[idxOfDstNode] = dst;
  return;
}

Assistant:

void KMaxDistance::addFirstPathToNodeAVL( MaxRec *srcRec, const int idxOfDstNode, const double edgeCost,
    const int numDistMaxs, MaxRec **maxs, NodeAVL **queue ){

    MaxRec *tmpRec = (MaxRec*)createNewMaxRec( idxOfDstNode, numDistMaxs );
    copyVals( srcRec, tmpRec );
    modifyDstMaxs( tmpRec, edgeCost );
    //tmpRec->back = srcRec->imgIdx;
    tmpRec->back = srcRec;
    tmpRec->qPtr = avlInsert( queue, tmpRec->sumVals, tmpRec );
    maxs[idxOfDstNode] = tmpRec;
}